

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

ParserString GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,bool *failed)

{
  UnionString UVar1;
  bool bVar2;
  bool bVar3;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  bool characterFound;
  ParserChar *s;
  ParserString value;
  char *local_28;
  ParserString local_10;
  
  ParserString::ParserString(&local_10);
  local_28 = (char *)*in_RDI;
  if (local_28 == (char *)0x0) {
    *in_RSI = 1;
  }
  else if (*local_28 == '\0') {
    *in_RSI = 1;
    *in_RDI = local_28;
  }
  else {
    do {
      bVar2 = isWhiteSpace(*local_28);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_00c5b9f2;
      }
      local_28 = local_28 + 1;
    } while (*local_28 != '\0');
    *in_RSI = 1;
    *in_RDI = local_28;
  }
LAB_00c5badd:
  UVar1.length = local_10.super_UnionString.length;
  UVar1.str = local_10.super_UnionString.str;
  return (ParserString)UVar1;
LAB_00c5b9f2:
  if (*local_28 == '\0') goto code_r0x00c5b9ff;
  bVar3 = isWhiteSpace(*local_28);
  if (bVar3) {
    if (bVar2) {
      *in_RDI = local_28;
      *in_RSI = 0;
    }
    else {
      *in_RSI = 1;
      *in_RDI = local_28;
      local_10.super_UnionString.str = (char *)0x0;
      local_10.super_UnionString.length = 0;
    }
    goto LAB_00c5badd;
  }
  if (!bVar2) {
    local_10.super_UnionString.str = local_28;
    bVar2 = true;
  }
  local_10.super_UnionString.length = local_10.super_UnionString.length + 1;
  local_28 = local_28 + 1;
  goto LAB_00c5b9f2;
code_r0x00c5b9ff:
  if (bVar2) {
    *in_RSI = 0;
    *in_RDI = local_28;
  }
  else {
    *in_RSI = 1;
    *in_RDI = local_28;
    local_10.super_UnionString.str = (char *)0x0;
    local_10.super_UnionString.length = 0;
  }
  goto LAB_00c5badd;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( *s == '\0' )
        {
            failed = true;
            *buffer = s;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( *s == '\0' )
            {
                failed = true;
                *buffer = s;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( *s == '\0' )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }